

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O0

vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> * __thiscall
AI::SoundMap::collectSounds
          (vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *__return_storage_ptr__,
          SoundMap *this,Vector2<float> position,int range)

{
  const_reference pvVar1;
  __normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
  local_b0;
  const_iterator local_a8;
  SoundWave *local_a0;
  __normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
  local_98;
  __normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
  local_90;
  const_iterator local_88;
  SoundWave *local_80;
  __normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
  local_78;
  int local_70;
  int local_6c;
  int k;
  int count;
  int index;
  int i;
  int j;
  float maxY;
  float minY;
  float maxX;
  float minX;
  Vector2<int> local_40;
  Vector2<float> local_38;
  Vector2<int> local_30;
  Vector2<int> gridCoordinates;
  int range_local;
  SoundMap *this_local;
  Vector2<float> position_local;
  vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *waves;
  
  gridCoordinates.x._3_1_ = 0;
  gridCoordinates.y = range;
  std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>::vector(__return_storage_ptr__);
  local_40 = this->gridSize;
  local_38 = position;
  local_30 = calcGridCoordinates(position,this->resolution,local_40);
  minY = Math::clamp((float)(local_30.x - gridCoordinates.y / 2),0.0,(float)(this->gridSize).x);
  maxY = Math::clamp((float)(local_30.x + gridCoordinates.y / 2),0.0,(float)(this->gridSize).x);
  j = (int)Math::clamp((float)(local_30.y - gridCoordinates.y / 2),0.0,(float)(this->gridSize).y);
  i = (int)Math::clamp((float)(local_30.y + gridCoordinates.y / 2),0.0,(float)(this->gridSize).y);
  for (index = (int)(float)j; (float)index < (float)i; index = index + 1) {
    for (count = (int)minY; (float)count < maxY; count = count + 1) {
      k = count + index * (this->gridSize).x;
      pvVar1 = std::vector<AI::Cell,_std::allocator<AI::Cell>_>::operator[](&this->grid,(long)k);
      local_6c = pvVar1->numberOfWaves;
      for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
        pvVar1 = std::vector<AI::Cell,_std::allocator<AI::Cell>_>::operator[](&this->grid,(long)k);
        std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>::push_back
                  (__return_storage_ptr__,pvVar1->intersectingWaves + local_70);
      }
    }
  }
  local_78._M_current =
       (SoundWave *)
       std::begin<std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>(__return_storage_ptr__);
  local_80 = (SoundWave *)
             std::end<std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>
                       (__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<AI::SoundWave*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>>
            (local_78,(__normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
                       )local_80);
  local_98._M_current =
       (SoundWave *)
       std::begin<std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>(__return_storage_ptr__);
  local_a0 = (SoundWave *)
             std::end<std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>
                       (__return_storage_ptr__);
  local_90 = std::
             unique<__gnu_cxx::__normal_iterator<AI::SoundWave*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>>
                       (local_98,(__normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
                                  )local_a0);
  __gnu_cxx::
  __normal_iterator<AI::SoundWave_const*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>::
  __normal_iterator<AI::SoundWave*>
            ((__normal_iterator<AI::SoundWave_const*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>
              *)&local_88,&local_90);
  local_b0._M_current =
       (SoundWave *)
       std::end<std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>(__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<AI::SoundWave_const*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>::
  __normal_iterator<AI::SoundWave*>
            ((__normal_iterator<AI::SoundWave_const*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>
              *)&local_a8,&local_b0);
  std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>::erase
            (__return_storage_ptr__,local_88,local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SoundWave> SoundMap::collectSounds(Math::Vector2<float> position, int range) const
	{
		std::vector<SoundWave> waves;
		
		auto gridCoordinates = calcGridCoordinates(position, resolution, gridSize);

		auto minX = clamp(gridCoordinates.x - range / 2, 0, gridSize.x);
		auto maxX = clamp(gridCoordinates.x + range / 2, 0, gridSize.x);
		auto minY = clamp(gridCoordinates.y - range / 2, 0, gridSize.y);
		auto maxY = clamp(gridCoordinates.y + range / 2, 0, gridSize.y);

		for (int j = minY; j < maxY; j++)
		{
			for (int i = minX; i < maxX; i++)
			{
				auto index = i + j * gridSize.x;
				auto count = grid[index].numberOfWaves;

				for (int k = 0; k < count; k++)
				{
					waves.push_back(grid[index].intersectingWaves[k]);
				}
			}
		}

		std::sort(begin(waves), end(waves));
		waves.erase(std::unique(begin(waves), end(waves)), end(waves));

		return waves;
	}